

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

ostream * covenant::operator<<
                    (ostream *o,
                    set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *s)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RDI;
  iterator et;
  iterator it;
  ostream *in_stack_ffffffffffffffc8;
  ostream *this;
  _Self local_20;
  _Self local_18 [2];
  ostream *local_8;
  
  local_8 = in_RDI;
  std::operator<<(in_RDI,"{");
  local_18[0]._M_node =
       (_Base_ptr)
       std::set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>::begin
                 ((set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *)
                  in_stack_ffffffffffffffc8);
  local_20._M_node =
       (_Base_ptr)
       std::set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>::end
                 ((set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> *)
                  in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    this = local_8;
    std::_Rb_tree_const_iterator<covenant::Sym>::operator*
              ((_Rb_tree_const_iterator<covenant::Sym> *)0x220ce6);
    poVar2 = operator<<(in_stack_ffffffffffffffc8,(Sym)(int)((ulong)this >> 0x20));
    std::operator<<(poVar2,";");
    std::_Rb_tree_const_iterator<covenant::Sym>::operator++
              ((_Rb_tree_const_iterator<covenant::Sym> *)this);
  }
  std::operator<<(local_8,"}");
  return local_8;
}

Assistant:

inline ostream& operator<<(ostream& o, const set<T> &s) {
    o << "{";
    for(typename set<T>::iterator it= s.begin(), et= s.end(); it!=et; ++it)
      o << *it << ";" ;
    o << "}";
    return o;
  }